

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O2

string * __thiscall
ut11::utility::ParseToString<std::shared_ptr<int>>::operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,shared_ptr<int> *value)

{
  ParseToString<int> local_52;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if ((value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"nullptr",(allocator *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"shared_ptr:",&local_51);
    ParseToString<int>::operator()[abi_cxx11_
              (&local_30,&local_52,
               (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::operator+(__return_storage_ptr__,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator()(const std::shared_ptr<T>& value) const
			{
				return value ? std::string("shared_ptr:") + ParseToString<T>()(*value) : "nullptr";
			}